

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StereoMatching.hpp
# Opt level: O0

Mat * ssd(Mat *in1,Mat *in2,string *type,bool add_constant)

{
  uchar uVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  size_type __n;
  uchar *puVar5;
  int *piVar6;
  byte *pbVar7;
  reference pvVar8;
  reference pvVar9;
  undefined7 in_register_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  byte in_R8B;
  int local_2b8;
  int delta_1;
  int j_1;
  int i_2;
  int delta;
  int j;
  int i_1;
  int sum_sd;
  int local_298;
  int local_294;
  int end_y;
  int local_28c;
  int local_288;
  int end_x;
  int local_280;
  int local_27c;
  int start_y;
  int local_274;
  int local_270;
  int start_x;
  int x_4;
  int y_2;
  int local_260;
  int local_25c;
  int x_3;
  int x_2;
  int y_1;
  int x_1;
  int x;
  int y;
  Mat tmp_1;
  int local_1e4;
  allocator<int> local_1dd;
  int offset;
  undefined1 local_1d8 [8];
  vector<int,_std::allocator<int>_> tmp;
  undefined1 local_1b8 [4];
  int i;
  Mat local_198 [8];
  Mat right;
  Mat local_128 [8];
  Mat left;
  undefined1 local_c8 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  min_ssd;
  Mat depth;
  int kernel_size;
  int max_offset;
  int local_3c;
  int local_38;
  int height;
  int local_30;
  byte local_29;
  int width;
  bool add_constant_local;
  string *type_local;
  Mat *in2_local;
  Mat *in1_local;
  Mat *tmp_2;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT71(in_register_00000009,add_constant);
  local_29 = in_R8B & 1;
  _width = __lhs;
  type_local = type;
  in2_local = in2;
  in1_local = in1;
  cv::MatSize::operator()((MatSize *)&local_38);
  local_30 = local_38;
  cv::MatSize::operator()((MatSize *)&kernel_size);
  local_3c = max_offset;
  cv::Mat::Mat((Mat *)&min_ssd.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,max_offset,local_30,0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_c8);
  bgr_to_grey(local_128);
  bgr_to_grey(local_198);
  if ((local_29 & 1) != 0) {
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_1b8,10.0);
    cv::operator+=(local_198,(Scalar *)local_1b8);
  }
  for (tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < local_3c;
      tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1) {
    __n = (size_type)local_30;
    offset = std::numeric_limits<int>::max();
    std::allocator<int>::allocator(&local_1dd);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_1d8,__n,&offset,&local_1dd);
    std::allocator<int>::~allocator(&local_1dd);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_c8,(value_type *)local_1d8);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1d8);
  }
  for (local_1e4 = 0; local_1e4 < 0x50; local_1e4 = local_1e4 + 1) {
    cv::Mat::Mat((Mat *)&x,local_3c,local_30,0);
    bVar3 = std::operator==(__lhs,"left");
    if (bVar3) {
      for (x_1 = 0; x_1 < local_3c; x_1 = x_1 + 1) {
        for (y_1 = 0; y_1 < local_1e4; y_1 = y_1 + 1) {
          puVar5 = cv::Mat::at<unsigned_char>(local_198,x_1,y_1);
          uVar1 = *puVar5;
          puVar5 = cv::Mat::at<unsigned_char>((Mat *)&x,x_1,y_1);
          *puVar5 = uVar1;
        }
        for (x_2 = local_1e4; x_2 < local_30; x_2 = x_2 + 1) {
          puVar5 = cv::Mat::at<unsigned_char>(local_198,x_1,x_2 - local_1e4);
          uVar1 = *puVar5;
          puVar5 = cv::Mat::at<unsigned_char>((Mat *)&x,x_1,x_2);
          *puVar5 = uVar1;
        }
      }
LAB_001094af:
      for (start_x = 0; start_x < local_3c; start_x = start_x + 1) {
        for (local_270 = 0; local_270 < local_30; local_270 = local_270 + 1) {
          start_y = 0;
          local_27c = local_270 + -3;
          piVar6 = std::max<int>(&start_y,&local_27c);
          local_274 = *piVar6;
          end_x = 0;
          local_288 = start_x + -3;
          piVar6 = std::max<int>(&end_x,&local_288);
          local_280 = *piVar6;
          end_y = local_30 + -1;
          local_294 = local_270 + 3;
          piVar6 = std::min<int>(&end_y,&local_294);
          local_28c = *piVar6;
          sum_sd = local_3c + -1;
          i_1 = start_x + 3;
          piVar6 = std::min<int>(&sum_sd,&i_1);
          local_298 = *piVar6;
          j = 0;
          bVar3 = std::operator==(__lhs,"left");
          if (bVar3) {
            for (delta = local_280; delta <= local_298; delta = delta + 1) {
              for (i_2 = local_274; i_2 <= local_28c; i_2 = i_2 + 1) {
                pbVar7 = cv::Mat::at<unsigned_char>(local_128,delta,i_2);
                bVar2 = *pbVar7;
                pbVar7 = cv::Mat::at<unsigned_char>((Mat *)&x,delta,i_2);
                iVar4 = (uint)bVar2 - (uint)*pbVar7;
                if (iVar4 < 1) {
                  iVar4 = -iVar4;
                }
                j = iVar4 * iVar4 + j;
              }
            }
          }
          else {
            for (delta_1 = local_280; delta_1 <= local_298; delta_1 = delta_1 + 1) {
              for (local_2b8 = local_274; local_2b8 <= local_28c; local_2b8 = local_2b8 + 1) {
                pbVar7 = cv::Mat::at<unsigned_char>(local_198,delta_1,local_2b8);
                bVar2 = *pbVar7;
                pbVar7 = cv::Mat::at<unsigned_char>((Mat *)&x,delta_1,local_2b8);
                iVar4 = (uint)bVar2 - (uint)*pbVar7;
                if (iVar4 < 1) {
                  iVar4 = -iVar4;
                }
                j = iVar4 * iVar4 + j;
              }
            }
          }
          pvVar8 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)local_c8,(long)start_x);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)local_270);
          if (j < *pvVar9) {
            pvVar8 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_c8,(long)start_x);
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)local_270);
            *pvVar9 = j;
            puVar5 = cv::Mat::at<unsigned_char>
                               ((Mat *)&min_ssd.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,start_x,
                                local_270);
            *puVar5 = (char)local_1e4 * '\x03';
          }
        }
      }
      x_4 = 0;
    }
    else {
      bVar3 = std::operator==(__lhs,"right");
      if (bVar3) {
        for (x_3 = 0; x_3 < local_3c; x_3 = x_3 + 1) {
          for (local_25c = 0; local_25c < local_30 - local_1e4; local_25c = local_25c + 1) {
            puVar5 = cv::Mat::at<unsigned_char>(local_128,x_3,local_25c + local_1e4);
            uVar1 = *puVar5;
            puVar5 = cv::Mat::at<unsigned_char>((Mat *)&x,x_3,local_25c);
            *puVar5 = uVar1;
          }
          for (local_260 = local_30 - local_1e4; local_260 < local_30; local_260 = local_260 + 1) {
            puVar5 = cv::Mat::at<unsigned_char>(local_128,x_3,local_260);
            uVar1 = *puVar5;
            puVar5 = cv::Mat::at<unsigned_char>((Mat *)&x,x_3,local_260);
            *puVar5 = uVar1;
          }
        }
        goto LAB_001094af;
      }
      y_2._3_1_ = 0;
      cv::Mat::Mat(in1,0,0,0);
      y_2._3_1_ = 1;
      x_4 = 1;
    }
    cv::Mat::~Mat((Mat *)&x);
    if (x_4 != 0) goto LAB_0010994b;
  }
  cv::Mat::Mat(in1,(Mat *)&min_ssd.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  x_4 = 1;
LAB_0010994b:
  cv::Mat::~Mat(local_198);
  cv::Mat::~Mat(local_128);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_c8);
  cv::Mat::~Mat((Mat *)&min_ssd.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return in1;
}

Assistant:

Mat
ssd(Mat in1, Mat in2, string type, bool add_constant=false)
{
    int width = in1.size().width;
    int height = in1.size().height;
    int max_offset = 79;
    int kernel_size = 3; // window size

    Mat depth(height, width, 0);
    vector< vector<int> > min_ssd; // store min SSD values

    Mat left = bgr_to_grey(in1);
    Mat right = bgr_to_grey(in2);

    if (add_constant)
    {
        right += 10;
    }

    for (int i = 0; i < height; ++i)
    {
        vector<int> tmp(width, numeric_limits<int>::max());
        min_ssd.push_back(tmp);
    }

    for (int offset = 0; offset <= max_offset; offset++)
    {
        Mat tmp(height, width, 0);
        // shift image depend on type to save calculation time
        if (type == "left")
        {
            for (int y = 0; y < height; y++)
            {
                for (int x = 0; x < offset; x++)
                {
                    tmp.at<uchar>(y, x) = right.at<uchar>(y, x);
                }

                for (int x = offset; x < width; x++)
                {
                    tmp.at<uchar>(y, x) = right.at<uchar>(y, x - offset);
                }
            }
        }
        else if (type == "right")
        {
            for (int y = 0; y < height; y++)
            {
                for (int x = 0; x < width - offset; x++)
                {
                    tmp.at<uchar>(y, x) = left.at<uchar>(y, x + offset);
                }

                for (int x = width - offset; x < width; x++)
                {
                    tmp.at<uchar>(y, x) = left.at<uchar>(y, x);
                }
            }
        }
        else
        {
            Mat tmp(0, 0, 0);
            return tmp;
        }

        // calculate each pixel's SSD value
        for (int y = 0; y < height; y++)
        {
            for (int x = 0; x < width; x++)
            {
                int start_x = max(0, x - kernel_size);
                int start_y = max(0, y - kernel_size);
                int end_x = min(width - 1, x + kernel_size);
                int end_y = min(height - 1, y + kernel_size);
                int sum_sd = 0;

                if (type == "left")
                {
                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            int delta = abs(left.at<uchar>(i, j) - tmp.at<uchar>(i, j));
                            sum_sd += delta * delta;
                        }
                    }
                }
                else
                {
                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            int delta = abs(right.at<uchar>(i, j) - tmp.at<uchar>(i, j));
                            sum_sd += delta * delta;
                        }
                    }
                }

                // smaller SSD value found
                if (sum_sd < min_ssd[y][x])
                {
                    min_ssd[y][x] = sum_sd;
                    // for better visualization
                    depth.at<uchar>(y, x) = (uchar)(offset * 3);
                }
            }
        }
    }

    return depth;
}